

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O1

uint32_t * FastPForLib::__fastunpack22_8(uint32_t *in,uint32_t *out)

{
  uint uVar1;
  uint uVar2;
  
  uVar1 = *in;
  *out = uVar1 & 0x3fffff;
  out[1] = uVar1 >> 0x16;
  uVar2 = in[1];
  out[1] = uVar1 >> 0x16 | (uVar2 & 0xfff) << 10;
  uVar1 = in[2];
  out[2] = uVar2 >> 0xc;
  out[2] = uVar2 >> 0xc | (uVar1 & 3) << 0x14;
  uVar2 = in[3];
  out[3] = uVar1 >> 2 & 0x3fffff;
  out[4] = uVar1 >> 0x18;
  out[4] = uVar1 >> 0x18 | (uVar2 & 0x3fff) << 8;
  uVar1 = in[4];
  out[5] = uVar2 >> 0xe;
  out[5] = uVar2 >> 0xe | (uVar1 & 0xf) << 0x12;
  out[6] = uVar1 >> 4 & 0x3fffff;
  uVar2 = in[5];
  out[7] = uVar1 >> 0x1a;
  out[7] = (uVar2 & 0xffff) << 6 | uVar1 >> 0x1a;
  return in + 6;
}

Assistant:

const uint32_t *__fastunpack22_8(const uint32_t *__restrict__ in,
                                 uint32_t *__restrict__ out) {

  *out = ((*in) >> 0) % (1U << 22);
  out++;
  *out = ((*in) >> 22);
  ++in;
  *out |= ((*in) % (1U << 12)) << (22 - 12);
  out++;
  *out = ((*in) >> 12);
  ++in;
  *out |= ((*in) % (1U << 2)) << (22 - 2);
  out++;
  *out = ((*in) >> 2) % (1U << 22);
  out++;
  *out = ((*in) >> 24);
  ++in;
  *out |= ((*in) % (1U << 14)) << (22 - 14);
  out++;
  *out = ((*in) >> 14);
  ++in;
  *out |= ((*in) % (1U << 4)) << (22 - 4);
  out++;
  *out = ((*in) >> 4) % (1U << 22);
  out++;
  *out = ((*in) >> 26);
  ++in;
  *out |= ((*in) % (1U << 16)) << (22 - 16);
  out++;

  return in + 1;
}